

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CadicalInterfacing.cpp
# Opt level: O1

void __thiscall
SAT::CadicalInterfacing::collectZeroImplied(CadicalInterfacing *this,SATLiteralStack *acc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Solver *this_00;
  uint uVar4;
  
  this_00 = &this->_solver;
  iVar1 = CaDiCaL::Solver::vars(this_00);
  if (0 < iVar1) {
    iVar1 = 0;
    uVar4 = 0xffffffff;
    do {
      iVar1 = iVar1 + 1;
      iVar2 = CaDiCaL::Solver::fixed(this_00,iVar1);
      if (iVar2 != 0) {
        uVar3 = 0;
        if (iVar2 < 1) {
          uVar3 = uVar4;
        }
        if (acc->_cursor == acc->_end) {
          ::Lib::Stack<SAT::SATLiteral>::expand(acc);
        }
        acc->_cursor->field_0 =
             (anon_union_4_2_6ac8864f_for_SATLiteral_0)(uVar3 >> 0x1f | iVar1 * 2);
        acc->_cursor = acc->_cursor + 1;
      }
      iVar2 = CaDiCaL::Solver::vars(this_00);
      uVar4 = uVar4 - 1;
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

void CadicalInterfacing::collectZeroImplied(SATLiteralStack& acc)
{
  for(int i = 1, val; i <= _solver.vars(); i++)
    if((val = _solver.fixed(i)))
      acc.push(cadical2Vampire(val > 0 ? i : -i));
}